

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

size_t write_int(MIR_context_t ctx,writer_func_t writer,int64_t i)

{
  size_t *psVar1;
  reduce_data *data;
  bool bVar2;
  size_t sVar3;
  uint8_t uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  if (writer == (writer_func_t)0x0) {
    return 0;
  }
  lVar7 = 0;
  uVar8 = i;
  if (i != 0) {
    do {
      lVar7 = lVar7 + 1;
      bVar2 = 0xff < uVar8;
      uVar8 = uVar8 >> 8;
    } while (bVar2);
  }
  uVar8 = lVar7 + (ulong)(lVar7 == 0);
  uVar4 = (char)uVar8 + '\b';
  data = ctx->io_ctx->io_reduce_data;
  uVar5 = data->buf_bound;
  if ((ulong)uVar5 < 0x40000) {
    data->buf_bound = uVar5 + 1;
    data->buf[uVar5] = uVar4;
  }
  else {
    _reduce_encode_buf(data);
    data->buf_bound = 1;
    data->buf[0] = uVar4;
  }
  if (0 < (int)uVar8) {
    uVar6 = uVar8 & 0xffffffff;
    do {
      put_byte(ctx,writer,(uint)i & 0xff);
      i = (ulong)i >> 8;
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  sVar3 = (long)(int)uVar8 + 1;
  psVar1 = &ctx->io_ctx->output_int_len;
  *psVar1 = *psVar1 + sVar3;
  return sVar3;
}

Assistant:

static size_t write_int (MIR_context_t ctx, writer_func_t writer, int64_t i) {
  size_t nb, len;

  if (writer == NULL) return 0;
  nb = int_length (i);
  assert (nb > 0);
  put_byte (ctx, writer, TAG_I1 + (int) nb - 1);
  len = put_int (ctx, writer, i, (int) nb) + 1;
  output_int_len += len;
  return len;
}